

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kinsol_ls.c
# Opt level: O0

int KINGetNumPrecEvals(void *kinmem,long *npevals)

{
  KINLsMem pKStack_30;
  int retval;
  KINLsMem kinls_mem;
  KINMem kin_mem;
  long *npevals_local;
  void *kinmem_local;
  
  kin_mem = (KINMem)npevals;
  npevals_local = (long *)kinmem;
  kinmem_local._4_4_ =
       kinLs_AccessLMem(kinmem,"KINGetNumPrecEvals",(KINMem *)&kinls_mem,&stack0xffffffffffffffd0);
  if (kinmem_local._4_4_ == 0) {
    kin_mem->kin_uround = (realtype)pKStack_30->npe;
    kinmem_local._4_4_ = 0;
  }
  return kinmem_local._4_4_;
}

Assistant:

int KINGetNumPrecEvals(void *kinmem, long int *npevals)
{
  KINMem   kin_mem;
  KINLsMem kinls_mem;
  int      retval;

  /* access KINLsMem structure; set output value and return */
  retval = kinLs_AccessLMem(kinmem, "KINGetNumPrecEvals",
                            &kin_mem, &kinls_mem);
  if (retval != KIN_SUCCESS)  return(retval);
  *npevals = kinls_mem->npe;
  return(KINLS_SUCCESS);
}